

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

void * ON_SubD__Allocate(size_t sz)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t sz1;
  double *a;
  size_t sz_local;
  
  if (sz == 0) {
    sz_local = 0;
  }
  else {
    a = (double *)sz;
    if ((sz & 7) != 0) {
      a = (double *)((8 - (sz & 7)) + sz);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    sz_local = (size_t)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
    if ((void *)sz_local == (void *)0x0) {
      ON_SubDIncrementErrorCount();
      sz_local = 0;
    }
  }
  return (void *)sz_local;
}

Assistant:

static void* ON_SubD__Allocate(size_t sz)
{
  if (0 == sz)
    return nullptr;

  // double array allocation is used to insure the memory
  // returned by new is properly aligned for any type.
  double* a;
  size_t sz1 = sz % sizeof(a[0]);
  if (sz1 > 0)
    sz += (sizeof(a[0]) - sz1);
  a = new(std::nothrow) double[sz];

  if (nullptr == a)
    return ON_SUBD_RETURN_ERROR(nullptr);

  return a;
}